

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O0

void __thiscall
xLearn::Predictor::Initialize
          (Predictor *this,Reader *reader,Model *model,Loss *loss,string *out,bool sign,bool sigmoid
          ,bool res_out)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  string *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  byte in_stack_00000010;
  Logger *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  int line;
  string *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  LogSeverity severity;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  Logger local_130;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  Logger local_e0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  Logger local_90;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  Logger local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  string *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_2b = in_stack_00000010 & 1;
  if (in_RSI == 0) {
    Logger::Logger(&local_30,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Initialize",&local_89);
    poVar3 = Logger::Start(severity,in_stack_fffffffffffffda8,line,in_stack_fffffffffffffd98);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x34);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"reader");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Logger::~Logger(in_stack_fffffffffffffd30);
    abort();
  }
  if (in_RDX == 0) {
    Logger::Logger(&local_90,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Initialize",&local_d9);
    poVar3 = Logger::Start(severity,in_stack_fffffffffffffda8,line,in_stack_fffffffffffffd98);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x35);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"model");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    Logger::~Logger(in_stack_fffffffffffffd30);
    abort();
  }
  if (in_RCX == 0) {
    Logger::Logger(&local_e0,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Initialize",&local_129);
    poVar3 = Logger::Start(severity,in_stack_fffffffffffffda8,line,in_stack_fffffffffffffd98);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x36);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"loss");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    Logger::~Logger(in_stack_fffffffffffffd30);
    abort();
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((local_2b != 0) && (bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) == 1)) {
    Logger::Logger(&local_130,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"Initialize",&local_179);
    poVar3 = Logger::Start(severity,in_stack_fffffffffffffda8,line,in_stack_fffffffffffffd98);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar4 = std::operator<<(poVar3,"true");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  *in_RDI = local_10;
  in_RDI[1] = local_18;
  in_RDI[2] = local_20;
  std::__cxx11::string::operator=((string *)(in_RDI + 3),local_28);
  *(byte *)(in_RDI + 10) = local_29 & 1;
  *(byte *)((long)in_RDI + 0x51) = local_2a & 1;
  *(byte *)((long)in_RDI + 0x52) = local_2b & 1;
  return;
}

Assistant:

void Initialize(Reader* reader,
                  Model* model,
                  Loss* loss,
                  const std::string& out,
                  bool sign = false,
                  bool sigmoid = false,
                  bool res_out = true) {
    CHECK_NOTNULL(reader);
    CHECK_NOTNULL(model);
    CHECK_NOTNULL(loss);
    if (res_out)
      CHECK_NE(out.empty(), true);
    reader_ = reader;
    model_ = model;
    loss_ = loss;
    out_file_ = out;
    sign_ = sign;
    sigmoid_ = sigmoid;
    res_out_ = res_out;
  }